

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifresexists(bifcxdef *ctx,int argc)

{
  runsdef *prVar1;
  appctxdef *paVar2;
  _func_int_void_ptr_char_ptr_size_t *p_Var3;
  void *pvVar4;
  int iVar5;
  size_t sVar6;
  dattyp typ;
  runsdef val;
  char resname [4096];
  runsdef rStack_1038;
  char local_1028 [4104];
  
  prVar1 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar1 + -1;
  if (prVar1[-1].runstyp == '\x03') {
    bifcstr(ctx,local_1028,0x1000,(ctx->bifcxrun->runcxsp->runsv).runsvstr);
    paVar2 = ctx->bifcxappctx;
    typ = 5;
    if ((paVar2 != (appctxdef *)0x0) &&
       (p_Var3 = paVar2->resfile_exists, p_Var3 != (_func_int_void_ptr_char_ptr_size_t *)0x0)) {
      pvVar4 = paVar2->resfile_exists_ctx;
      sVar6 = strlen(local_1028);
      iVar5 = (*p_Var3)(pvVar4,local_1028,sVar6);
      typ = (uint)(iVar5 != 0) * 3 + 5;
    }
    runpush(ctx->bifcxrun,typ,&rStack_1038);
    return;
  }
  ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
  runsign(ctx->bifcxrun,0x3ef);
}

Assistant:

void bifresexists(bifcxdef *ctx, int argc)
{
    uchar *p;
    char resname[OSFNMAX];
    appctxdef *appctx;
    int found;
    runsdef val;
    
    /* check for proper arguments */
    bifcntargs(ctx, 1, argc);

    /* get the resource name string */
    p = runpopstr(ctx->bifcxrun);
    bifcstr(ctx, resname, (size_t)sizeof(resname), p);

    /* 
     *   if we have a host application context, and it provides a resource
     *   finder function, ask the resource finder if the resource is
     *   available; otherwise, report that the resource is not loadable,
     *   since we must not be running a version of the interpreter that
     *   supports external resource loading 
     */
    appctx = ctx->bifcxappctx;
    found = (appctx != 0
             && appctx->resfile_exists != 0
             && (*appctx->resfile_exists)(appctx->resfile_exists_ctx,
                                          resname, strlen(resname)));

    /* push the result */
    runpush(ctx->bifcxrun, runclog(found), &val);
}